

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *p,int fSeq)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_01;
  bool bVar5;
  int local_44;
  int local_3c;
  int nRegs;
  int i;
  int nRealCos;
  int nRealCis;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRoots;
  Tim_Man_t *pManTime;
  int fSeq_local;
  Gia_Man_t *p_local;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar1 = Tim_ManPiNum(p_00);
  iVar2 = Tim_ManPoNum(p_00);
  if (fSeq == 0) {
    local_44 = 0;
  }
  else {
    local_44 = Gia_ManRegBoxNum(p);
  }
  iVar3 = Gia_ManRegNum(p);
  if (iVar3 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x61,"void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *, int)");
  }
  iVar3 = Gia_ManBoxNum(p);
  if (iVar3 < 1) {
    __assert_fail("Gia_ManBoxNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x62,"void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *, int)");
  }
  Gia_ManIncrementTravId(p);
  pGVar4 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar4);
  for (local_3c = 0; local_3c < iVar1 - local_44; local_3c = local_3c + 1) {
    pGVar4 = Gia_ManPi(p,local_3c);
    Gia_ObjSetTravIdCurrent(p,pGVar4);
  }
  iVar1 = Gia_ManRegBoxNum(p);
  p_01 = Vec_IntAlloc(iVar1);
  local_3c = Gia_ManPoNum(p);
  for (local_3c = local_3c - iVar2; iVar1 = Gia_ManPoNum(p), local_3c < iVar1 - local_44;
      local_3c = local_3c + 1) {
    pGVar4 = Gia_ManPo(p,local_3c);
    Gia_ObjSetTravIdCurrent(p,pGVar4);
    pGVar4 = Gia_ManPo(p,local_3c);
    pGVar4 = Gia_ObjFanin0(pGVar4);
    Gia_ManMarkSeqGiaWithBoxes_rec(p,pGVar4,p_01);
  }
  if (fSeq != 0) {
    local_3c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p_01);
      bVar5 = false;
      if (local_3c < iVar1) {
        iVar1 = Vec_IntEntry(p_01,local_3c);
        _nRealCos = Gia_ManObj(p,iVar1);
        bVar5 = _nRealCos != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ObjIsCo(_nRealCos);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                      ,0x74,"void Gia_ManMarkSeqGiaWithBoxes(Gia_Man_t *, int)");
      }
      Gia_ObjSetTravIdCurrent(p,_nRealCos);
      pGVar4 = Gia_ObjFanin0(_nRealCos);
      Gia_ManMarkSeqGiaWithBoxes_rec(p,pGVar4,p_01);
      local_3c = local_3c + 1;
    }
  }
  Vec_IntFree(p_01);
  return;
}

Assistant:

void Gia_ManMarkSeqGiaWithBoxes( Gia_Man_t * p, int fSeq )
{
    // CI order: real PIs + flop outputs + box outputs
    // CO order: box inputs + real POs + flop inputs
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int nRealCis = Tim_ManPiNum(pManTime);
    int nRealCos = Tim_ManPoNum(pManTime);
    int i, nRegs = fSeq ? Gia_ManRegBoxNum(p) : 0;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManBoxNum(p) > 0 );
    // mark the terminals
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nRealCis - nRegs; i++ )
        Gia_ObjSetTravIdCurrent( p, Gia_ManPi(p, i) );
    // collect flops reachable from the POs
    vRoots = Vec_IntAlloc( Gia_ManRegBoxNum(p) );
    for ( i = Gia_ManPoNum(p) - nRealCos; i < Gia_ManPoNum(p) - nRegs; i++ )
    {
        Gia_ObjSetTravIdCurrent( p, Gia_ManPo(p, i) );
        Gia_ManMarkSeqGiaWithBoxes_rec( p, Gia_ObjFanin0(Gia_ManPo(p, i)), vRoots );
    }
    // collect flops reachable from roots
    if ( fSeq )
    {
        Gia_ManForEachObjVec( vRoots, p, pObj, i )
        {
            assert( Gia_ObjIsCo(pObj) );
            Gia_ObjSetTravIdCurrent( p, pObj );
            Gia_ManMarkSeqGiaWithBoxes_rec( p, Gia_ObjFanin0(pObj), vRoots );
        }
        //printf( "Explored %d flops\n", Vec_IntSize(vRoots) );
    }
    Vec_IntFree( vRoots );
}